

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cc
# Opt level: O0

void Log::set_level(Level _level)

{
  Level _level_local;
  
  level = _level;
  Logger::apply_level(&Verbose);
  Logger::apply_level(&Debug);
  Logger::apply_level(&Info);
  Logger::apply_level(&Warn);
  Logger::apply_level(&Error);
  return;
}

Assistant:

void
Log::set_level(Log::Level _level) {
  level = _level;
  Verbose.apply_level();
  Debug.apply_level();
  Info.apply_level();
  Warn.apply_level();
  Error.apply_level();
}